

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_expanded_sql(sqlite3_stmt *pStmt)

{
  char *pcVar1;
  sqlite3_stmt *in_RDI;
  Vdbe *p;
  char *zSql;
  char *z;
  Vdbe *in_stack_00000028;
  undefined8 local_10;
  
  local_10 = (char *)0x0;
  pcVar1 = sqlite3_sql(in_RDI);
  if (pcVar1 != (char *)0x0) {
    sqlite3_mutex_enter((sqlite3_mutex *)0x141f58);
    local_10 = sqlite3VdbeExpandSql(in_stack_00000028,(char *)pStmt);
    sqlite3_mutex_leave((sqlite3_mutex *)0x141f7d);
  }
  return local_10;
}

Assistant:

SQLITE_API char *sqlite3_expanded_sql(sqlite3_stmt *pStmt){
#ifdef SQLITE_OMIT_TRACE
  return 0;
#else
  char *z = 0;
  const char *zSql = sqlite3_sql(pStmt);
  if( zSql ){
    Vdbe *p = (Vdbe *)pStmt;
    sqlite3_mutex_enter(p->db->mutex);
    z = sqlite3VdbeExpandSql(p, zSql);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return z;
#endif
}